

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
spoa::Graph::ExtractSubgraph
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Graph *this,Node *begin,
          Node *end)

{
  bool bVar1;
  bool bVar2;
  size_type __n;
  reference ppNVar3;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *this_00;
  reference ppEVar4;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *this_01;
  reference rVar5;
  reference local_f8;
  reference local_e8;
  Node **it_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range3_1;
  Edge **it;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range3;
  _Bit_type local_a0;
  value_type local_98;
  value_type curr;
  stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
  stack;
  allocator<bool> local_2b;
  bool local_2a;
  byte local_29;
  Node *local_28;
  Node *end_local;
  Node *begin_local;
  Graph *this_local;
  vector<bool,_std::allocator<bool>_> *dst;
  
  local_29 = 0;
  local_28 = end;
  end_local = begin;
  begin_local = (Node *)this;
  this_local = (Graph *)__return_storage_ptr__;
  __n = std::
        vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
        ::size(&this->nodes_);
  local_2a = false;
  std::allocator<bool>::allocator(&local_2b);
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__,__n,&local_2a,&local_2b);
  std::allocator<bool>::~allocator(&local_2b);
  std::
  stack<spoa::Graph::Node_const*,std::deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>>>
  ::stack<std::deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>>,void>
            ((stack<spoa::Graph::Node_const*,std::deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>>>
              *)&curr);
  std::
  stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
  ::push((stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
          *)&curr,&end_local);
  while( true ) {
    bVar1 = std::
            stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
            ::empty((stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
                     *)&curr);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppNVar3 = std::
              stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
              ::top((stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
                     *)&curr);
    local_98 = *ppNVar3;
    std::
    stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
    ::pop((stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
           *)&curr);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (__return_storage_ptr__,(ulong)local_98->id);
    local_a0 = rVar5._M_mask;
    __range3 = (vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)rVar5._M_p;
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range3);
    bVar1 = false;
    if (!bVar2) {
      bVar1 = local_28->id <= local_98->id;
    }
    if (bVar1) {
      this_00 = &local_98->inedges;
      __end3 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                         (this_00);
      it = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                              (this_00);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                    *)&it);
        if (!bVar1) break;
        ppEVar4 = __gnu_cxx::
                  __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                  ::operator*(&__end3);
        std::
        stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
        ::push((stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
                *)&curr,&(*ppEVar4)->tail);
        __gnu_cxx::
        __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
        ::operator++(&__end3);
      }
      this_01 = &local_98->aligned_nodes;
      __end3_1 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                           (this_01);
      it_1 = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                                (this_01);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                            *)&it_1);
        if (!bVar1) break;
        local_e8 = __gnu_cxx::
                   __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                   ::operator*(&__end3_1);
        std::
        stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
        ::push((stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
                *)&curr,local_e8);
        __gnu_cxx::
        __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
        ::operator++(&__end3_1);
      }
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (__return_storage_ptr__,(ulong)local_98->id);
      local_f8 = rVar5;
      std::_Bit_reference::operator=(&local_f8,true);
    }
  }
  local_29 = 1;
  std::
  stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
  ::~stack((stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
            *)&curr);
  if ((local_29 & 1) == 0) {
    std::vector<bool,_std::allocator<bool>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> Graph::ExtractSubgraph(const Node* begin, const Node* end) const {  // NOLINT
  std::vector<bool> dst(nodes_.size(), false);
  std::stack<const Node*> stack;
  stack.push(begin);

  while (!stack.empty()) {
    auto curr = stack.top();
    stack.pop();

    if (!dst[curr->id] && curr->id >= end->id) {
      for (const auto& it : curr->inedges) {
        stack.push(it->tail);
      }
      for (const auto& it : curr->aligned_nodes) {
        stack.push(it);
      }
      dst[curr->id] = true;
    }
  }

  return dst;
}